

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O2

char * Gia_ObjGetDumpName(Vec_Ptr_t *vNames,char c,int i,int d)

{
  int iVar1;
  char *pcVar2;
  
  if (vNames == (Vec_Ptr_t *)0x0) {
    sprintf(Gia_ObjGetDumpName::pBuffer,"%c%0*d%c");
  }
  else {
    pcVar2 = (char *)Vec_PtrEntry(vNames,i);
    iVar1 = Gia_ManNameIsLegalInVerilog(pcVar2);
    if (iVar1 != 0) {
      pcVar2 = strcpy(Gia_ObjGetDumpName::pBuffer,pcVar2);
      return pcVar2;
    }
    sprintf(Gia_ObjGetDumpName::pBuffer,"\\%s ",pcVar2);
  }
  return Gia_ObjGetDumpName::pBuffer;
}

Assistant:

char * Gia_ObjGetDumpName( Vec_Ptr_t * vNames, char c, int i, int d )
{
    static char pBuffer[10000];
    if ( vNames )
    {
        char * pName = (char *)Vec_PtrEntry(vNames, i);
        if ( Gia_ManNameIsLegalInVerilog(pName) )
            sprintf( pBuffer, "%s", pName );
        else
            sprintf( pBuffer, "\\%s ", pName );
    }
    else
        sprintf( pBuffer, "%c%0*d%c", c, d, i, c );
    return pBuffer;
}